

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseField(WastParser *this,Field *field)

{
  bool bVar1;
  Result RVar2;
  
  bVar1 = MatchLpar(this,Field);
  if (bVar1) {
    ParseBindVarOpt(this,&field->name);
    bVar1 = MatchLpar(this,Mut);
    if (bVar1) {
      field->mutable_ = true;
      RVar2 = ParseValueType(this,&field->type);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      RVar2 = Expect(this,Rpar);
    }
    else {
      field->mutable_ = false;
      RVar2 = ParseValueType(this,&field->type);
    }
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = Expect(this,Rpar);
  }
  else {
    bVar1 = MatchLpar(this,Mut);
    if (bVar1) {
      field->mutable_ = true;
      RVar2 = ParseValueType(this,&field->type);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      RVar2 = Expect(this,Rpar);
    }
    else {
      field->mutable_ = false;
      RVar2 = ParseValueType(this,&field->type);
    }
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result WastParser::ParseField(Field* field) {
  WABT_TRACE(ParseField);
  auto parse_mut_valuetype = [&]() -> Result {
    // TODO: Share with ParseGlobalType?
    if (MatchLpar(TokenType::Mut)) {
      field->mutable_ = true;
      CHECK_RESULT(ParseValueType(&field->type));
      EXPECT(Rpar);
    } else {
      field->mutable_ = false;
      CHECK_RESULT(ParseValueType(&field->type));
    }
    return Result::Ok;
  };

  if (MatchLpar(TokenType::Field)) {
    ParseBindVarOpt(&field->name);
    CHECK_RESULT(parse_mut_valuetype());
    EXPECT(Rpar);
  } else {
    CHECK_RESULT(parse_mut_valuetype());
  }

  return Result::Ok;
}